

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O3

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
::ComputeViolations(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>
                    *this,SolCheck *chk)

{
  int *piVar1;
  double dVar2;
  char cVar3;
  _Map_pointer ppCVar4;
  _Elt_pointer pCVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  Container *pCVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar16;
  double dVar17;
  double dVar18;
  allocator<char> local_89;
  mapped_type *local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *local_80;
  double local_78;
  double local_70;
  key_type local_68;
  double local_48;
  undefined8 uStack_40;
  
  ppCVar4 = (this->cons_).
            super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar7 = ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * -0x1084210842108421 +
          ((long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x1084210842108421 +
          ((long)ppCVar4 -
           (long)(this->cons_).
                 super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppCVar4 == (_Map_pointer)0x0);
  if ((lVar7 != 0) && (iVar6 = (int)lVar7, iVar6 != 0)) {
    local_80 = &chk->viol_cons_alg_;
    lVar14 = (long)iVar6;
    local_88 = (mapped_type *)0x0;
    lVar7 = lVar14 * 0x1f0;
    do {
      lVar14 = lVar14 + -1;
      pCVar5 = (this->cons_).
               super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      lVar8 = ((long)pCVar5 -
               (long)(this->cons_).
                     super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) * -0x1084210842108421 +
              lVar14;
      lVar15 = in_ST0;
      if (lVar8 == 0) {
        if ((&pCVar5[-1].is_unused_)[lVar7] == '\0') {
          pCVar10 = (Container *)
                    ((long)&pCVar5[-1].con_.con_flat_.super_QuadAndLinTerms.super_LinTerms.coefs_.
                            super_small_vector_base<std::allocator<double>,_6U> + lVar7 + -0x20);
          cVar3 = (&pCVar5[-1].is_bridged_)[lVar7];
          goto LAB_0018e449;
        }
      }
      else {
        pCVar10 = (this->cons_).
                  super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[lVar8];
        if (pCVar10->is_unused_ == '\0') {
          cVar3 = pCVar10->is_bridged_;
LAB_0018e449:
          uVar11 = (uint)(cVar3 == '\0') << 3;
          uVar13 = uVar11 | 2;
          if (pCVar10->depth_ != 0) {
            uVar13 = uVar11;
          }
          if (uVar13 == 0) {
            uVar13 = 4;
          }
          if ((chk->check_mode_ & uVar13) != 0) {
            if (lVar8 == 0) {
              pCVar10 = (Container *)
                        ((long)&pCVar5[-1].con_.con_flat_.super_QuadAndLinTerms.super_LinTerms.
                                coefs_.super_small_vector_base<std::allocator<double>,_6U> +
                        lVar7 + -0x20);
            }
            else {
              pCVar10 = (this->cons_).
                        super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[lVar8];
            }
            lVar15 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
            in_ST6 = in_ST7;
            QuadAndLinTerms::
            ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                      ((longdouble *)&(pCVar10->con_).con_flat_.super_QuadAndLinTerms,
                       (QuadAndLinTerms *)chk,
                       (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
                       ((ulong)(cVar3 == '\0') << 3));
            local_70 = (double)in_ST0;
            dVar2 = (pCVar10->con_).con_flat_.super_AlgConRhs<1>.rhs_;
            dVar17 = dVar2 - local_70;
            in_ST7 = in_ST6;
            dVar16 = dVar17;
            if (dVar2 <= local_70) {
              dVar16 = local_70 + -INFINITY;
              if (local_70 + -INFINITY <= dVar17) {
                dVar16 = dVar17;
              }
              dVar18 = 0.0;
              if (chk->feastol_ <= dVar16 && dVar16 != chk->feastol_) {
LAB_0018e525:
                if (local_88 == (mapped_type *)0x0) {
                  uStack_40 = 0;
                  local_78 = dVar16;
                  local_48 = dVar18;
                  pcVar9 = BasicConstraintKeeper::GetShortTypeName
                                     (&this->super_BasicConstraintKeeper);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_68,pcVar9,&local_89);
                  local_88 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                             ::operator[](local_80,&local_68);
                  dVar16 = local_78;
                  dVar18 = local_48;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p != &local_68.field_2) {
                    operator_delete(local_68._M_dataplus._M_p,
                                    local_68.field_2._M_allocated_capacity + 1);
                    dVar16 = local_78;
                    dVar18 = local_48;
                  }
                }
                lVar8 = 2 - (ulong)(uVar13 < 8);
                if ((uVar13 & 2) != 0) {
                  lVar8 = 0;
                }
                pCVar5 = (this->cons_).
                         super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur;
                lVar12 = ((long)pCVar5 -
                          (long)(this->cons_).
                                super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) *
                         -0x1084210842108421 + lVar14;
                if (lVar12 == 0) {
                  pCVar10 = (Container *)
                            ((long)&pCVar5[-1].con_.con_flat_.super_QuadAndLinTerms.super_LinTerms.
                                    coefs_.super_small_vector_base<std::allocator<double>,_6U> +
                            lVar7 + -0x20);
                }
                else {
                  pCVar10 = (this->cons_).
                            super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>_>::Container>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node[lVar12];
                }
                piVar1 = &local_88->_M_elems[0].N_ + (lVar8 * 5 & 0xffffffffU) * 2;
                pcVar9 = (pCVar10->con_).con_flat_.super_BasicConstraint.name_._M_dataplus._M_p;
                *piVar1 = *piVar1 + 1;
                if (*(double *)(piVar1 + 2) <= dVar16 && dVar16 != *(double *)(piVar1 + 2)) {
                  *(double *)(piVar1 + 2) = dVar16;
                  *(char **)(piVar1 + 4) = pcVar9;
                }
                if (*(double *)(piVar1 + 6) <= dVar18 && dVar18 != *(double *)(piVar1 + 6)) {
                  *(double *)(piVar1 + 6) = dVar18;
                  *(char **)(piVar1 + 8) = pcVar9;
                }
              }
            }
            else if (chk->feastol_ <= dVar17 && dVar17 != chk->feastol_) {
              dVar18 = 0.0;
              if (((dVar2 == 0.0) && (!NAN(dVar2))) ||
                 (dVar18 = ABS(dVar17 / dVar2),
                 chk->feastolrel_ <= dVar18 && dVar18 != chk->feastolrel_)) goto LAB_0018e525;
            }
          }
        }
      }
      in_ST0 = lVar15;
      lVar7 = lVar7 + -0x1f0;
    } while (lVar14 != 0);
  }
  return;
}

Assistant:

void ComputeViolations(SolCheck& chk) override {
    if (cons_.size()) {
      auto& conviolmap =
          cons_.front().GetCon().IsLogical() ?
            chk.ConViolLog() :
            chk.ConViolAlg();
      const auto& x = chk.x_ext();
      ViolSummArray<3>* conviolarray {nullptr};
      for (int i=(int)cons_.size(); i--; ) {
        if (!cons_[i].IsUnused()) {
          int c_class = 0;    // class of this constraint
          if (!cons_[i].IsBridged())
            c_class |= 8;     // solver-side constraint
          if (!cons_[i].GetDepth())
            c_class |= 2;     // top-level
          if (!c_class)
            c_class = 4;      // intermediate
          if (c_class & chk.check_mode()) {
            auto viol = cons_[i].GetCon().ComputeViolation(x);
            auto cr = viol.Check(
                  chk.GetFeasTol(), chk.GetFeasTolRel());
            if (cr.first) {
              if (!conviolarray)
                conviolarray =         // lazy map access
                    &conviolmap[GetShortTypeName()];
              /// index==0,1,2: original, interm, solver-side
              /// If both orig and solver, report as orig
              int index = (c_class & 2) ? 0
                                        : (c_class & 8)
                                          ? 2 : 1;
              assert(index < (int)conviolarray->size());
              (*conviolarray)[index].CountViol(
                    viol, cr.second, cons_[i].GetCon().name());
            }
          }
        }
      }
    }
  }